

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

shared_ptr<(anonymous_namespace)::schema> __thiscall
anon_unknown.dwarf_4926e::type_schema::make
          (type_schema *this,json *schema,value_t type,root_schema *root,
          vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *uris,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *kw)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer __first;
  double dVar2;
  element_type *peVar3;
  iterator iVar4;
  iterator iVar5;
  primitive_iterator_t pVar6;
  undefined8 uVar7;
  format_checker *pfVar8;
  bool bVar9;
  _Invoker_type p_Var10;
  long lVar11;
  root_schema *prVar12;
  json_value jVar13;
  reference pbVar14;
  reference pbVar15;
  unsigned_long uVar16;
  string_type *psVar17;
  string_type *psVar18;
  _Link_type p_Var19;
  uchar *puVar20;
  ulong uVar21;
  ulong uVar22;
  pointer __result;
  pointer ppVar23;
  pointer ppVar24;
  root_schema *prVar25;
  _Link_type p_Var26;
  invalid_argument *piVar27;
  _Tp_alloc_type *__alloc;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var28;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *__args;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *__args_00;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Base_ptr *this_01;
  internal_iterator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Manager_type *pp_Var29;
  _Tp_alloc_type *p_Var30;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar31;
  shared_ptr<(anonymous_namespace)::schema> sVar32;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  __allocator_type __a2_7;
  __allocator_type __a2;
  json_value jStack_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_398 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  iterator attr_2;
  undefined1 local_2f8 [16];
  const_iterator attr;
  string local_2c8 [2];
  type_schema *local_270;
  __allocator_type __a2_6;
  allocator_type local_261;
  format_checker *local_260;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::array,_std::allocator<(anonymous_namespace)::array>,_(__gnu_cxx::_Lock_policy)2>_>_>
  __guard;
  iterator __end4;
  undefined1 local_220 [32];
  _Base_ptr *local_200;
  __allocator_type __a2_4;
  json_value ajStack_1f0 [3];
  schema local_1d8;
  undefined1 local_1b8 [8];
  internal_iterator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  local_198;
  schema *local_168;
  _Manager_type *local_160;
  iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_158;
  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_150;
  __allocator_type __a2_3;
  __allocator_type __a2_1;
  json_value jStack_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_110;
  string local_100 [80];
  undefined1 local_b0 [24];
  json_value local_98;
  internal_iterator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_90;
  _func_int **local_78;
  root_schema *prStack_70;
  undefined1 local_58 [24];
  undefined8 local_40;
  iterator local_38;
  
  _Var28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(in_register_00000011,type)
  ;
  local_270 = this;
  switch((ulong)_Var28._M_pi & 0xffffffff) {
  case 0:
    prVar12 = (root_schema *)operator_new(0x30);
    attr.m_object = (pointer)&__a2_1;
    *(undefined8 *)((long)&(prVar12->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar12->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_00155178;
    pp_Var29 = &(prVar12->loader_).super__Function_base._M_manager;
    anon_unknown.dwarf_4926e::schema::schema((schema *)pp_Var29,root);
    (prVar12->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__001551c8;
    attr.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::null,_std::allocator<(anonymous_namespace)::null>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::null,_std::allocator<(anonymous_namespace)::null>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&attr);
    break;
  case 1:
    local_40 = 0;
    prVar12 = (root_schema *)operator_new(0x100);
    ___a2_3 = &__a2_6;
    *(undefined8 *)((long)&(prVar12->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar12->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_00155498;
    local_168 = (schema *)&(prVar12->loader_).super__Function_base._M_manager;
    anon_unknown.dwarf_4926e::schema::schema(local_168,root);
    (prVar12->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__001554e8;
    *(undefined1 *)&(prVar12->format_check_).super__Function_base._M_manager = 0;
    (prVar12->format_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar12->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    local_160 = &(prVar12->content_check_).super__Function_base._M_manager;
    *(undefined4 *)&(prVar12->files_)._M_t._M_impl = 0;
    this_00 = &(prVar12->root_).
               super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    *(undefined8 *)&(prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    *(undefined8 *)((long)&(prVar12->content_check_).super__Function_base._M_functor + 8) = 0;
    (prVar12->content_check_).super__Function_base._M_manager = (_Manager_type)0x0;
    (prVar12->content_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar12->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&prVar12->files_;
    (prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)&prVar12->files_;
    local_200 = (_Base_ptr *)&(prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_260 = &prVar12[1].format_check_;
    p_Var10 = (_Invoker_type)((long)&prVar12[1].format_check_.super__Function_base._M_functor + 8);
    *(undefined4 *)((long)&prVar12[1].format_check_.super__Function_base._M_functor + 8) = 0;
    prVar12[1].format_check_.super__Function_base._M_manager = (_Manager_type)0x0;
    (prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&prVar12[1].loader_.super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&prVar12[1].loader_.super__Function_base._M_functor + 8) = 0;
    prVar12[1].loader_.super__Function_base._M_manager = (_Manager_type)0x0;
    prVar12[1].loader_._M_invoker = (_Invoker_type)0x0;
    prVar12[1].format_check_._M_invoker = p_Var10;
    *(_Invoker_type *)&prVar12[1].content_check_.super__Function_base._M_functor = p_Var10;
    *(undefined8 *)((long)&prVar12[1].content_check_.super__Function_base._M_functor + 8) = 0;
    prVar12[1].content_check_.super__Function_base._M_manager = (_Manager_type)0x0;
    prVar12[1].content_check_._M_invoker = (_Invoker_type)0x0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[14],_0>((iterator *)&__a2,schema,(char (*) [14])"maxProperties");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__a2,(iterator *)&attr);
    if (bVar9) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&__a2);
      p_Var10 = (_Invoker_type)
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<unsigned_long,_0>(pbVar15);
      *(undefined1 *)&(prVar12->format_check_).super__Function_base._M_manager = 1;
      (prVar12->format_check_)._M_invoker = p_Var10;
      __end4.m_object = (pointer)___a2;
      __end4.m_it.object_iterator._M_node = (_Base_ptr)jStack_3a0;
      __end4.m_it.array_iterator._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            *)aaStack_398[0]._0_8_;
      __end4.m_it.primitive_iterator.m_it = aaStack_398[0]._8_8_;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr,schema,&__end4);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[14],_0>((iterator *)&attr,schema,(char (*) [14])"minProperties");
    pVar6 = attr.m_it.primitive_iterator;
    iVar5 = attr.m_it.array_iterator;
    iVar4 = attr.m_it.object_iterator;
    ___a2 = (json_value)attr.m_object;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__a2,(iterator *)&attr);
    if (bVar9) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&__a2);
      uVar16 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::get_impl<unsigned_long,_0>(pbVar15);
      (prVar12->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      *(unsigned_long *)((long)&(prVar12->content_check_).super__Function_base._M_functor + 8) =
           uVar16;
      local_220._0_8_ = ___a2;
      local_220._8_8_ = iVar4._M_node;
      local_220._16_8_ = iVar5._M_current;
      local_220._24_8_ = pVar6.m_it;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_220);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[9],_0>((iterator *)&attr,schema,(char (*) [9])"required");
    pVar6 = attr.m_it.primitive_iterator;
    iVar5 = attr.m_it.array_iterator;
    iVar4 = attr.m_it.object_iterator;
    ___a2 = (json_value)attr.m_object;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__a2,(iterator *)&attr);
    if (bVar9) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&__a2);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (&attr,pbVar15);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_160,&attr);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&attr);
      local_150.m_object = (pointer)___a2;
      local_150.m_it.object_iterator._M_node = iVar4._M_node;
      local_150.m_it.array_iterator._M_current = iVar5._M_current;
      local_150.m_it.primitive_iterator.m_it = pVar6.m_it;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr,schema,&local_150);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[11],_0>((iterator *)&attr,schema,(char (*) [11])0x13882a);
    pVar6 = attr.m_it.primitive_iterator;
    iVar5 = attr.m_it.array_iterator;
    iVar4 = attr.m_it.object_iterator;
    ___a2 = (json_value)attr.m_object;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__a2,(iterator *)&attr);
    if (bVar9) {
      __guard._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::array,_std::allocator<(anonymous_namespace)::array>,_(__gnu_cxx::_Lock_policy)2>_>
            *)nlohmann::json_abi_v3_11_2::detail::
              iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)&__a2);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::begin((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&attr,(iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)&__guard);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)&attr_2,
            (iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)&__guard);
      while (bVar9 = nlohmann::json_abi_v3_11_2::detail::
                     iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::
                     operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                               ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&attr,&attr_2), bVar9) {
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&__a2_1,
                   (iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&attr);
        psVar17 = nlohmann::json_abi_v3_11_2::detail::
                  iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)&__a2_1);
        pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&__a2_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98.boolean,"properties",(allocator<char> *)local_58);
        psVar18 = nlohmann::json_abi_v3_11_2::detail::
                  iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)&__a2_1);
        std::__cxx11::string::string((string *)&local_78,(string *)psVar18);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)&local_98;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1b8,__l_00,(allocator_type *)&local_1d8);
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                  ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_b0,uris)
        ;
        anon_unknown.dwarf_4926e::schema::make
                  ((schema *)&__a2_4,pbVar15,root,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1b8,
                   (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_b0);
        std::__cxx11::string::string((string *)&local_198,(string *)psVar17);
        local_198.second.
        super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)___a2_4;
        local_198.second.
        super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ajStack_1f0[0];
        ___a2_4 = (pointer)0x0;
        ajStack_1f0[0].object = (object_t *)0x0;
        p_Var19 = (_Link_type)operator_new(0x50);
        _Var28._M_pi = local_198.second.
                       super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
        p_Var26 = (_Link_type)&p_Var19->_M_storage;
        puVar20 = (p_Var19->_M_storage)._M_storage + 0x10;
        *(uchar **)(p_Var19->_M_storage)._M_storage = puVar20;
        paVar1 = &local_198.first.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198.first._M_dataplus._M_p == paVar1) {
          *(size_type *)puVar20 = local_198.first.field_2._M_allocated_capacity;
          *(undefined8 *)((p_Var19->_M_storage)._M_storage + 0x18) = local_198.first.field_2._8_8_;
        }
        else {
          *(pointer *)
           ((__aligned_membuf<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>
             *)p_Var26)->_M_storage = local_198.first._M_dataplus._M_p;
          *(size_type *)puVar20 = local_198.first.field_2._M_allocated_capacity;
        }
        *(size_type *)((p_Var19->_M_storage)._M_storage + 8) = local_198.first._M_string_length;
        local_198.first._M_string_length = 0;
        local_198.first.field_2._M_allocated_capacity =
             local_198.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_198.second.
        super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(element_type **)((p_Var19->_M_storage)._M_storage + 0x20) =
             local_198.second.
             super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((p_Var19->_M_storage)._M_storage + 0x28)
             = _Var28._M_pi;
        local_198.second.
        super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_198.first._M_dataplus._M_p = (pointer)paVar1;
        pVar31 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                 ::_M_get_insert_unique_pos
                           ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                             *)this_00,(key_type *)p_Var26);
        if (pVar31.second == (_Base_ptr)0x0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
          ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                          *)p_Var19,p_Var26);
        }
        else {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
          ::_M_insert_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                            *)this_00,pVar31.first,pVar31.second,p_Var19);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
        ::~pair(&local_198);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)ajStack_1f0);
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                  ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1b8);
        lVar11 = 0x20;
        do {
          std::__cxx11::string::~string((string *)((long)&local_98 + lVar11));
          lVar11 = lVar11 + -0x20;
        } while (lVar11 != -0x20);
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::~iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&__a2_1);
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator++((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&attr);
      }
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&attr_2);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&attr);
      local_198.first._M_dataplus._M_p = (pointer)___a2;
      local_198.first._M_string_length = (size_type)iVar4._M_node;
      local_198.first.field_2._M_allocated_capacity = (size_type)iVar5._M_current;
      local_198.first.field_2._8_8_ = pVar6.m_it;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_198);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[18],_0>((iterator *)&attr,schema,(char (*) [18])"patternProperties");
    pVar6 = attr.m_it.primitive_iterator;
    iVar5 = attr.m_it.array_iterator;
    iVar4 = attr.m_it.object_iterator;
    ___a2 = (object_t *)attr.m_object;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__a2,(iterator *)&attr);
    if (bVar9) {
      local_2f8._0_8_ =
           nlohmann::json_abi_v3_11_2::detail::
           iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__a2);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::begin((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&attr,(iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)local_2f8);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)&attr_2,
            (iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)local_2f8);
      while( true ) {
        bVar9 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&attr,&attr_2);
        if (!bVar9) break;
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&__a2_1,
                   (iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&attr);
        psVar17 = nlohmann::json_abi_v3_11_2::detail::
                  iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)&__a2_1);
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_1b8,psVar17,0x10);
        pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&__a2_1);
        psVar17 = nlohmann::json_abi_v3_11_2::detail::
                  iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)&__a2_1);
        std::__cxx11::string::string((string *)&__a2_4,(string *)psVar17);
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)&__a2_4;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__guard,__l_01,(allocator_type *)&local_158);
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                  ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_58,uris)
        ;
        anon_unknown.dwarf_4926e::schema::make
                  (&local_1d8,pbVar15,root,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__guard,
                   (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_58);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_98,
                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8);
        local_78 = local_1d8._vptr_schema;
        prStack_70 = local_1d8.root_;
        local_1d8._vptr_schema = (_func_int **)0x0;
        local_1d8.root_ = (root_schema *)0x0;
        ppVar24 = *(pointer *)&prVar12[1].loader_.super__Function_base._M_functor;
        if (ppVar24 == *(pointer *)((long)&prVar12[1].loader_.super__Function_base._M_functor + 8))
        {
          __first = (pointer)*local_200;
          lVar11 = (long)ppVar24 - (long)__first;
          if (lVar11 == 0x7fffffffffffffe0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar21 = lVar11 / 0x30;
          __args_00 = (pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                       *)(lVar11 % 0x30);
          uVar22 = uVar21;
          if (ppVar24 == __first) {
            uVar22 = 1;
          }
          __alloc = (_Tp_alloc_type *)(uVar22 + uVar21);
          if ((_Tp_alloc_type *)0x2aaaaaaaaaaaaa9 < __alloc) {
            __alloc = (_Tp_alloc_type *)0x2aaaaaaaaaaaaaa;
          }
          p_Var30 = (_Tp_alloc_type *)0x2aaaaaaaaaaaaaa;
          if (!CARRY8(uVar22,uVar21)) {
            p_Var30 = __alloc;
          }
          if (p_Var30 == (_Tp_alloc_type *)0x0) {
            __result = (pointer)0x0;
          }
          else {
            __result = (pointer)operator_new((long)p_Var30 * 0x30);
            __args_00 = extraout_RDX;
          }
          std::
          allocator_traits<std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>>
          ::
          construct<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>,std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>
                    ((allocator_type *)(__result + uVar21),
                     (pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                      *)&local_98,__args_00);
          ppVar23 = std::
                    vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                    ::_S_relocate(__first,ppVar24,__result,__alloc);
          ppVar24 = std::
                    vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                    ::_S_relocate(ppVar24,ppVar24,ppVar23 + 1,__alloc);
          lVar11 = *(long *)((long)&prVar12[1].loader_.super__Function_base._M_functor + 8) -
                   (long)__first;
          std::
          _Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
          ::_M_deallocate((_Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                           *)__first,(pointer)(lVar11 / 0x30),lVar11 % 0x30);
          (prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)__result;
          *(pointer *)&prVar12[1].loader_.super__Function_base._M_functor = ppVar24;
          *(pointer *)((long)&prVar12[1].loader_.super__Function_base._M_functor + 8) =
               __result + (long)p_Var30;
        }
        else {
          std::
          allocator_traits<std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>>
          ::
          construct<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>,std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>
                    ((allocator_type *)ppVar24,
                     (pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                      *)&local_98,__args);
          *(long *)&prVar12[1].loader_.super__Function_base._M_functor =
               *(long *)&prVar12[1].loader_.super__Function_base._M_functor + 0x30;
        }
        std::
        pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
        ::~pair((pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                 *)&local_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1d8.root_);
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                  ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_58);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__guard);
        std::__cxx11::string::~string((string *)&__a2_4);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8);
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::~iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&__a2_1);
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator++((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&attr);
      }
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&attr_2);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&attr);
      local_98 = ___a2;
      local_90.object_iterator._M_node = iVar4._M_node;
      local_90.array_iterator._M_current = iVar5._M_current;
      local_90.primitive_iterator.m_it = pVar6.m_it;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_98);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[21],_0>((iterator *)&attr,schema,(char (*) [21])"additionalProperties");
    pVar6 = attr.m_it.primitive_iterator;
    iVar5 = attr.m_it.array_iterator;
    iVar4 = attr.m_it.object_iterator;
    ___a2 = (json_value)attr.m_object;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__a2,(iterator *)&attr);
    if (bVar9) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&__a2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&attr,"additionalProperties",(allocator<char> *)local_1b8);
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&attr;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&attr_2,__l_02,(allocator_type *)&__guard);
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&__a2_4,uris);
      anon_unknown.dwarf_4926e::schema::make
                ((schema *)&__a2_1,pbVar15,root,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&attr_2,
                 (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&__a2_4);
      std::shared_ptr<(anonymous_namespace)::schema>::operator=
                ((shared_ptr<(anonymous_namespace)::schema> *)
                 &prVar12[1].loader_.super__Function_base._M_manager,
                 (shared_ptr<(anonymous_namespace)::schema> *)&__a2_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&jStack_118);
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&__a2_4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&attr_2);
      std::__cxx11::string::~string((string *)&attr);
      local_1b8 = (undefined1  [8])___a2;
      local_1b0.object_iterator._M_node = iVar4._M_node;
      local_1b0.array_iterator._M_current = iVar5._M_current;
      local_1b0.primitive_iterator.m_it = pVar6.m_it;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_1b8);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[13],_0>((iterator *)&attr,schema,(char (*) [13])"dependencies");
    pVar6 = attr.m_it.primitive_iterator;
    iVar5 = attr.m_it.array_iterator;
    iVar4 = attr.m_it.object_iterator;
    ___a2 = (json_value)attr.m_object;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__a2,(iterator *)&attr);
    if (bVar9) {
      local_158.container =
           nlohmann::json_abi_v3_11_2::detail::
           iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__a2);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::begin((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&attr,&local_158);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)&attr_2,&local_158);
      while( true ) {
        bVar9 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&attr,&attr_2);
        if (!bVar9) break;
        pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&attr);
        if (pbVar15->m_type == array) {
          psVar17 = nlohmann::json_abi_v3_11_2::detail::
                    iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)&attr);
          pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&attr);
          nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                    ((iterator)&__a2_1,pbVar15);
          local_2f8._0_8_ = (pointer)0x0;
          prVar25 = (root_schema *)operator_new(0x48);
          __guard._M_alloc =
               (allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::array,_std::allocator<(anonymous_namespace)::array>,_(__gnu_cxx::_Lock_policy)2>_>
                *)&__a2_7;
          *(undefined8 *)((long)&(prVar25->loader_).super__Function_base._M_functor + 8) =
               0x100000001;
          *(undefined ***)&(prVar25->loader_).super__Function_base._M_functor =
               &PTR___Sp_counted_ptr_inplace_00155538;
          pp_Var29 = &(prVar25->loader_).super__Function_base._M_manager;
          __guard._M_ptr = (pointer)prVar25;
          anon_unknown.dwarf_4926e::schema::schema((schema *)pp_Var29,root);
          (prVar25->loader_).super__Function_base._M_manager =
               (_Manager_type)&PTR_make_for_default__00155588;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&(prVar25->format_check_).super__Function_base._M_manager,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__a2_1);
          __guard._M_ptr = (pointer)0x0;
          local_2f8._0_8_ = pp_Var29;
          local_2f8._8_8_ = prVar25;
          std::
          __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::required,_std::allocator<(anonymous_namespace)::required>,_(__gnu_cxx::_Lock_policy)2>_>_>
          ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::required,_std::allocator<(anonymous_namespace)::required>,_(__gnu_cxx::_Lock_policy)2>_>_>
                              *)&__guard);
          p_Var26 = (_Link_type)operator_new(0x50);
          p_Var19 = (_Link_type)&p_Var26->_M_storage;
          std::__cxx11::string::string((string *)p_Var19,(string *)psVar17);
          pfVar8 = local_260;
          uVar7 = local_2f8._8_8_;
          local_2f8._8_8_ = (root_schema *)0x0;
          *(undefined8 *)((p_Var26->_M_storage)._M_storage + 0x20) = local_2f8._0_8_;
          *(undefined8 *)((p_Var26->_M_storage)._M_storage + 0x28) = uVar7;
          local_2f8._0_8_ = (reference)0x0;
          pVar31 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                   ::_M_get_insert_unique_pos
                             ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                               *)local_260,(key_type *)p_Var19);
          if (pVar31.second == (_Base_ptr)0x0) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
            ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                            *)p_Var26,p_Var19);
          }
          else {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
            ::_M_insert_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                              *)pfVar8,pVar31.first,pVar31.second,p_Var26);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2f8 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__a2_1);
        }
        else {
          psVar17 = nlohmann::json_abi_v3_11_2::detail::
                    iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)&attr);
          pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&attr);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&__a2_1,"dependencies",(allocator<char> *)&__a2_7);
          psVar18 = nlohmann::json_abi_v3_11_2::detail::
                    iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)&attr);
          std::__cxx11::string::string(local_100,(string *)psVar18);
          __l_03._M_len = 2;
          __l_03._M_array = (iterator)&__a2_1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__guard,__l_03,&local_261);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_1d8,
                     uris);
          anon_unknown.dwarf_4926e::schema::make
                    ((schema *)local_2f8,pbVar15,root,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__guard,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_1d8);
          p_Var26 = (_Link_type)operator_new(0x50);
          p_Var19 = (_Link_type)&p_Var26->_M_storage;
          std::__cxx11::string::string((string *)p_Var19,(string *)psVar17);
          pfVar8 = local_260;
          uVar7 = local_2f8._8_8_;
          local_2f8._8_8_ = (root_schema *)0x0;
          *(undefined8 *)((p_Var26->_M_storage)._M_storage + 0x20) = local_2f8._0_8_;
          *(undefined8 *)((p_Var26->_M_storage)._M_storage + 0x28) = uVar7;
          local_2f8._0_8_ = (reference)0x0;
          pVar31 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                   ::_M_get_insert_unique_pos
                             ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                               *)local_260,(key_type *)p_Var19);
          if (pVar31.second == (_Base_ptr)0x0) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
            ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                            *)p_Var26,p_Var19);
          }
          else {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
            ::_M_insert_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                              *)pfVar8,pVar31.first,pVar31.second,p_Var26);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2f8 + 8));
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_1d8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__guard);
          lVar11 = 0x20;
          do {
            std::__cxx11::string::~string((string *)(&__a2_1 + lVar11));
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != -0x20);
        }
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator++((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&attr);
      }
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&attr_2);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&attr);
      attr.m_object = (pointer)___a2;
      attr.m_it.object_iterator = iVar4;
      attr.m_it.array_iterator = iVar5;
      attr.m_it.primitive_iterator = pVar6;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                (&attr_2,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[14],_0>(&attr_2,schema,(char (*) [14])"propertyNames");
    pVar6 = attr_2.m_it.primitive_iterator;
    iVar5 = attr_2.m_it.array_iterator;
    iVar4 = attr_2.m_it.object_iterator;
    ___a2 = (json_value)attr_2.m_object;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end(&attr_2,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__a2,&attr_2);
    if (bVar9) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&__a2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&attr_2,"propertyNames",(allocator<char> *)&local_158);
      __l_04._M_len = 1;
      __l_04._M_array = (iterator)&attr_2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__a2_1,__l_04,(allocator_type *)&__a2_7);
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&__guard,uris);
      anon_unknown.dwarf_4926e::schema::make
                ((schema *)local_2f8,pbVar15,root,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__a2_1,
                 (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&__guard);
      std::shared_ptr<(anonymous_namespace)::schema>::operator=
                ((shared_ptr<(anonymous_namespace)::schema> *)
                 &prVar12[1].content_check_.super__Function_base._M_manager,
                 (shared_ptr<(anonymous_namespace)::schema> *)local_2f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2f8 + 8));
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&__guard);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__a2_1);
      std::__cxx11::string::~string((string *)&attr_2);
      attr_2.m_object = (pointer)___a2;
      attr_2.m_it.object_iterator = iVar4;
      attr_2.m_it.array_iterator = iVar5;
      attr_2.m_it.primitive_iterator = pVar6;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&__a2_1,schema,&attr_2);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[8],_0>((iterator *)&__a2_1,schema,(char (*) [8])"default");
    ___a2 = (json_value)___a2_1;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&__a2_1,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__a2,(iterator *)&__a2_1);
    if (bVar9) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&__a2);
      anon_unknown.dwarf_4926e::schema::set_default_value(local_168,pbVar15);
    }
    this_02 = (internal_iterator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)&local_38;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::object,_std::allocator<(anonymous_namespace)::object>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::object,_std::allocator<(anonymous_namespace)::object>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&__a2_3);
    (local_270->super_schema)._vptr_schema = (_func_int **)local_168;
    local_38._M_node = (_Base_ptr)0x0;
    goto LAB_0011a3b0;
  case 2:
    local_58._0_8_ = (pointer)0x0;
    prVar12 = (root_schema *)operator_new(0xa0);
    __guard._M_alloc = &__a2_3;
    *(undefined8 *)((long)&(prVar12->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar12->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_00155618;
    local_260 = (format_checker *)&(prVar12->loader_).super__Function_base._M_manager;
    __guard._M_ptr = (pointer)prVar12;
    anon_unknown.dwarf_4926e::schema::schema((schema *)local_260,root);
    (prVar12->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__00155668;
    *(undefined1 *)&(prVar12->format_check_).super__Function_base._M_manager = 0;
    (prVar12->format_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar12->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar12->content_check_).super__Function_base._M_functor + 8) = 0;
    *(undefined1 *)&(prVar12->content_check_).super__Function_base._M_manager = 0;
    (prVar12->content_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar12->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (prVar12->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)&(prVar12->files_)._M_t._M_impl = 0;
    *(undefined8 *)&(prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[9],_0>(&attr_2,schema,(char (*) [9])"maxItems");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr_2,(iterator *)&attr);
    if (bVar9) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr_2);
      p_Var10 = (_Invoker_type)
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<unsigned_long,_0>(pbVar15);
      *(undefined1 *)&(prVar12->format_check_).super__Function_base._M_manager = 1;
      (prVar12->format_check_)._M_invoker = p_Var10;
      ___a2_1 = (pointer)attr_2.m_object;
      jStack_118 = (json_value)attr_2.m_it.object_iterator._M_node;
      aStack_110._M_allocated_capacity = (size_type)attr_2.m_it.array_iterator._M_current;
      aStack_110._8_8_ = attr_2.m_it.primitive_iterator.m_it;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&__a2_1);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[9],_0>((iterator *)&attr,schema,(char (*) [9])"minItems");
    attr_2.m_it.array_iterator = attr.m_it.array_iterator;
    attr_2.m_it.primitive_iterator = attr.m_it.primitive_iterator;
    attr_2.m_object = attr.m_object;
    attr_2.m_it.object_iterator = attr.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr_2,(iterator *)&attr);
    if (bVar9) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr_2);
      uVar16 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::get_impl<unsigned_long,_0>(pbVar15);
      (prVar12->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      *(unsigned_long *)((long)&(prVar12->content_check_).super__Function_base._M_functor + 8) =
           uVar16;
      local_98.object = (object_t *)attr_2.m_object;
      local_90.object_iterator._M_node = attr_2.m_it.object_iterator._M_node;
      local_90.array_iterator._M_current = attr_2.m_it.array_iterator._M_current;
      local_90.primitive_iterator.m_it = attr_2.m_it.primitive_iterator.m_it;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_98);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[12],_0>((iterator *)&attr,schema,(char (*) [12])"uniqueItems");
    attr_2.m_it.array_iterator = attr.m_it.array_iterator;
    attr_2.m_it.primitive_iterator = attr.m_it.primitive_iterator;
    attr_2.m_object = attr.m_object;
    attr_2.m_it.object_iterator = attr.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr_2,(iterator *)&attr);
    if (bVar9) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr_2);
      bVar9 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<bool,_0>(pbVar15);
      *(bool *)&(prVar12->content_check_).super__Function_base._M_manager = bVar9;
      local_198.first._M_dataplus._M_p = (pointer)attr_2.m_object;
      local_198.first._M_string_length = (size_type)attr_2.m_it.object_iterator._M_node;
      local_198.first.field_2._M_allocated_capacity =
           (size_type)attr_2.m_it.array_iterator._M_current;
      local_198.first.field_2._8_8_ = attr_2.m_it.primitive_iterator.m_it;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_198);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[6],_0>((iterator *)&attr,schema,(char (*) [6])0x138903);
    attr_2.m_it.array_iterator = attr.m_it.array_iterator;
    attr_2.m_it.primitive_iterator = attr.m_it.primitive_iterator;
    attr_2.m_object = attr.m_object;
    attr_2.m_it.object_iterator = attr.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr_2,(iterator *)&attr);
    if (bVar9) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr_2);
      if (pbVar15->m_type == array) {
        pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*(&attr_2);
        local_200 = &(prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::begin((iterator *)&__a2,pbVar15);
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::end(&__end4,pbVar15);
        uVar16 = 0;
        while (bVar9 = nlohmann::json_abi_v3_11_2::detail::
                       iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::
                       operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                 ((iterator *)&__a2,&__end4), bVar9) {
          pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iterator *)&__a2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&attr,"items",(allocator<char> *)&__a2_4);
          std::__cxx11::to_string(local_2c8,uVar16);
          __l._M_len = 2;
          __l._M_array = (iterator)&attr;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_220,__l,(allocator_type *)local_b0);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_150,
                     uris);
          anon_unknown.dwarf_4926e::schema::make
                    ((schema *)local_1b8,pbVar15,root,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_220,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_150);
          std::
          vector<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
          ::push_back((vector<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                       *)&(prVar12->root_).
                          super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,(value_type *)local_1b8);
          uVar16 = uVar16 + 1;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b0);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_150);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_220);
          lVar11 = 0x20;
          do {
            std::__cxx11::string::~string
                      ((string *)((long)&local_2c8[-1]._M_dataplus._M_p + lVar11));
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != -0x20);
          nlohmann::json_abi_v3_11_2::detail::
          iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::operator++((iterator *)&__a2);
        }
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::find<const_char_(&)[16],_0>((iterator *)&attr,schema,(char (*) [16])"additionalItems");
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::end((iterator *)&__a2,schema);
        bVar9 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&attr,(iterator *)&__a2);
        if (bVar9) {
          pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&attr);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&__a2,"additionalItems",(allocator<char> *)&__a2_4);
          __l_06._M_len = 1;
          __l_06._M_array = (iterator)&__a2;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__end4,__l_06,(allocator_type *)local_b0);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_1b8,
                     uris);
          anon_unknown.dwarf_4926e::schema::make
                    ((schema *)local_220,pbVar15,root,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__end4,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_1b8);
          std::shared_ptr<(anonymous_namespace)::schema>::operator=
                    ((shared_ptr<(anonymous_namespace)::schema> *)local_200,
                     (shared_ptr<(anonymous_namespace)::schema> *)local_220);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_220 + 8));
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_1b8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__end4);
          std::__cxx11::string::~string((string *)&__a2);
          ___a2 = (json_value)attr.m_object;
          nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                    (&__end4,schema,
                     (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&__a2);
        }
      }
      else {
        pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*(&attr_2);
        if ((pbVar15->m_type == object) ||
           (pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                      iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*(&attr_2), pbVar15->m_type == boolean)) {
          pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*(&attr_2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&attr,"items",(allocator<char> *)local_220);
          __l_05._M_len = 1;
          __l_05._M_array = (iterator)&attr;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__a2,__l_05,(allocator_type *)local_1b8);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_150,
                     uris);
          anon_unknown.dwarf_4926e::schema::make
                    ((schema *)&__end4,pbVar15,root,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__a2,(vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)
                              &local_150);
          std::shared_ptr<(anonymous_namespace)::schema>::operator=
                    ((shared_ptr<(anonymous_namespace)::schema> *)
                     &(prVar12->content_check_)._M_invoker,
                     (shared_ptr<(anonymous_namespace)::schema> *)&__end4);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__end4.m_it);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_150);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__a2);
          std::__cxx11::string::~string((string *)&attr);
        }
      }
      attr.m_object = attr_2.m_object;
      attr.m_it.object_iterator = attr_2.m_it.object_iterator;
      attr.m_it.array_iterator = attr_2.m_it.array_iterator;
      attr.m_it.primitive_iterator = attr_2.m_it.primitive_iterator;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                (&__end4,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[9],_0>(&__end4,schema,(char (*) [9])"contains");
    attr_2.m_it.array_iterator = __end4.m_it.array_iterator;
    attr_2.m_it.primitive_iterator = __end4.m_it.primitive_iterator;
    attr_2.m_object = __end4.m_object;
    attr_2.m_it.object_iterator = __end4.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end(&__end4,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr_2,&__end4);
    if (bVar9) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr_2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__end4,"contains",(allocator<char> *)&local_1d8);
      __l_07._M_len = 1;
      __l_07._M_array = (iterator)&__end4;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_220,__l_07,(allocator_type *)local_2f8);
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&__a2_4,uris);
      anon_unknown.dwarf_4926e::schema::make
                ((schema *)local_b0,pbVar15,root,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_220,
                 (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&__a2_4);
      std::shared_ptr<(anonymous_namespace)::schema>::operator=
                ((shared_ptr<(anonymous_namespace)::schema> *)
                 &(prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                 (shared_ptr<(anonymous_namespace)::schema> *)local_b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&__a2_4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_220);
      std::__cxx11::string::~string((string *)&__end4);
      __end4.m_object = attr_2.m_object;
      __end4.m_it.object_iterator = attr_2.m_it.object_iterator;
      __end4.m_it.array_iterator = attr_2.m_it.array_iterator;
      __end4.m_it.primitive_iterator = attr_2.m_it.primitive_iterator;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_220,schema,&__end4);
    }
    this_02 = (internal_iterator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)(local_58 + 8);
    __guard._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::array,_std::allocator<(anonymous_namespace)::array>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&__guard);
    (local_270->super_schema)._vptr_schema = (_func_int **)local_260;
    local_58._8_8_ = (pointer)0x0;
LAB_0011a3b0:
    (local_270->super_schema).root_ = prVar12;
    goto LAB_0011a45f;
  case 3:
    local_1b8 = (undefined1  [8])0x0;
    prVar12 = (root_schema *)operator_new(0x108);
    local_150.m_object = (pointer)&__a2_4;
    *(undefined8 *)((long)&(prVar12->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar12->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_00155358;
    pp_Var29 = &(prVar12->loader_).super__Function_base._M_manager;
    local_150.m_it.object_iterator._M_node = (_Base_ptr)prVar12;
    anon_unknown.dwarf_4926e::schema::schema((schema *)pp_Var29,root);
    (prVar12->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__001553a8;
    *(undefined1 *)&(prVar12->format_check_).super__Function_base._M_manager = 0;
    (prVar12->format_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar12->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar12->content_check_).super__Function_base._M_functor + 8) = 0;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&attr);
    *(undefined1 *)&(prVar12->content_check_).super__Function_base._M_manager = 0;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &(prVar12->content_check_)._M_invoker,
               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&attr);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&attr);
    *(_Base_ptr **)&(prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_header =
         &(prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    (prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    *(undefined1 *)&(prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = 0;
    *(undefined1 *)&(prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(_Manager_type **)&prVar12[1].loader_.super__Function_base._M_functor =
         &prVar12[1].loader_.super__Function_base._M_manager;
    *(undefined8 *)((long)&prVar12[1].loader_.super__Function_base._M_functor + 8) = 0;
    *(undefined1 *)&prVar12[1].loader_.super__Function_base._M_manager = 0;
    std::_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string>::
    _Tuple_impl<char_const(&)[1],char_const(&)[1],void>
              ((_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string> *)
               &prVar12[1].format_check_,(char (*) [1])0x137dfe,(char (*) [1])0x137dfe);
    *(undefined1 *)
     &prVar12[1].root_.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = 0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[10],_0>(&attr_2,schema,(char (*) [10])"maxLength");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr_2,(iterator *)&attr);
    if (bVar9) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr_2);
      p_Var10 = (_Invoker_type)
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<unsigned_long,_0>(pbVar15);
      *(undefined1 *)&(prVar12->format_check_).super__Function_base._M_manager = 1;
      (prVar12->format_check_)._M_invoker = p_Var10;
      ___a2_1 = (pointer)attr_2.m_object;
      jStack_118 = (json_value)attr_2.m_it.object_iterator._M_node;
      aStack_110._M_allocated_capacity = (size_type)attr_2.m_it.array_iterator._M_current;
      aStack_110._8_8_ = attr_2.m_it.primitive_iterator.m_it;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&__a2_1);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[10],_0>((iterator *)&attr,schema,(char (*) [10])"minLength");
    attr_2.m_it.array_iterator = attr.m_it.array_iterator;
    attr_2.m_it.primitive_iterator = attr.m_it.primitive_iterator;
    attr_2.m_object = attr.m_object;
    attr_2.m_it.object_iterator = attr.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr_2,(iterator *)&attr);
    if (bVar9) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr_2);
      uVar16 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::get_impl<unsigned_long,_0>(pbVar15);
      (prVar12->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      *(unsigned_long *)((long)&(prVar12->content_check_).super__Function_base._M_functor + 8) =
           uVar16;
      local_98.object = (object_t *)attr_2.m_object;
      local_90.object_iterator._M_node = attr_2.m_it.object_iterator._M_node;
      local_90.array_iterator._M_current = attr_2.m_it.array_iterator._M_current;
      local_90.primitive_iterator.m_it = attr_2.m_it.primitive_iterator.m_it;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_98);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[16],_0>((iterator *)&attr,schema,(char (*) [16])"contentEncoding");
    attr_2.m_it.array_iterator = attr.m_it.array_iterator;
    attr_2.m_it.primitive_iterator = attr.m_it.primitive_iterator;
    attr_2.m_object = attr.m_object;
    attr_2.m_it.object_iterator = attr.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr_2,(iterator *)&attr);
    if (bVar9) {
      *(undefined1 *)
       &prVar12[1].root_.
        super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr_2);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&attr,pbVar15);
      std::__cxx11::string::operator=((string *)&prVar12[1].content_check_,(string *)&attr);
      std::__cxx11::string::~string((string *)&attr);
      local_198.first._M_dataplus._M_p = (pointer)attr_2.m_object;
      local_198.first._M_string_length = (size_type)attr_2.m_it.object_iterator._M_node;
      local_198.first.field_2._M_allocated_capacity =
           (size_type)attr_2.m_it.array_iterator._M_current;
      local_198.first.field_2._8_8_ = attr_2.m_it.primitive_iterator.m_it;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_198);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[17],_0>((iterator *)&attr,schema,(char (*) [17])"contentMediaType");
    attr_2.m_it.array_iterator = attr.m_it.array_iterator;
    attr_2.m_it.primitive_iterator = attr.m_it.primitive_iterator;
    attr_2.m_object = attr.m_object;
    attr_2.m_it.object_iterator = attr.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr_2,(iterator *)&attr);
    if (bVar9) {
      *(undefined1 *)
       &prVar12[1].root_.
        super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr_2);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&attr,pbVar15);
      std::__cxx11::string::operator=((string *)&prVar12[1].format_check_,(string *)&attr);
      std::__cxx11::string::~string((string *)&attr);
      ___a2 = (json_value)attr_2.m_object;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&__a2);
    }
    if ((*(char *)&prVar12[1].root_.
                   super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr == '\x01') && (*(long *)((prVar12->loader_)._M_invoker + 0x50) == 0)) {
      piVar27 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar27,
                 "schema contains contentEncoding/contentMediaType but content checker was not set")
      ;
      __cxa_throw(piVar27,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[8],_0>((iterator *)&attr,schema,(char (*) [8])"pattern");
    attr_2.m_it.array_iterator = attr.m_it.array_iterator;
    attr_2.m_it.primitive_iterator = attr.m_it.primitive_iterator;
    attr_2.m_object = attr.m_object;
    attr_2.m_it.object_iterator = attr.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr_2,(iterator *)&attr);
    if (bVar9) {
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr_2);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&attr,pbVar15);
      std::__cxx11::string::operator=
                ((string *)&(prVar12->files_)._M_t._M_impl.super__Rb_tree_header,(string *)&attr);
      std::__cxx11::string::~string((string *)&attr);
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr_2);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_220,pbVar15);
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&__end4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,0x10
                );
      attr.m_object = (pointer)CONCAT71(attr.m_object._1_7_,1);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&attr.m_it,
                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&__end4);
      std::pair<bool,_std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>::
      operator=((pair<bool,_std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> *)
                &(prVar12->content_check_).super__Function_base._M_manager,(type)&attr);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&attr.m_it);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&__end4);
      std::__cxx11::string::~string((string *)local_220);
      __end4.m_object = attr_2.m_object;
      __end4.m_it.object_iterator = attr_2.m_it.object_iterator;
      __end4.m_it.array_iterator = attr_2.m_it.array_iterator;
      __end4.m_it.primitive_iterator = attr_2.m_it.primitive_iterator;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr,schema,&__end4);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[7],_0>((iterator *)&attr,schema,(char (*) [7])"format");
    attr_2.m_it.array_iterator = attr.m_it.array_iterator;
    attr_2.m_it.primitive_iterator = attr.m_it.primitive_iterator;
    attr_2.m_object = attr.m_object;
    attr_2.m_it.object_iterator = attr.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&attr,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr_2,(iterator *)&attr);
    if (bVar9) {
      if (*(long *)((prVar12->loader_)._M_invoker + 0x30) == 0) {
        piVar27 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr,
                       "a format checker was not provided but a format keyword for this string is present: "
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (prVar12 + 1));
        std::invalid_argument::invalid_argument(piVar27,(string *)&attr);
        __cxa_throw(piVar27,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr_2);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_220,pbVar15);
      attr.m_object = (pointer)CONCAT71(attr.m_object._1_7_,1);
      attr.m_it.object_iterator._M_node = (_Base_ptr)&attr.m_it.primitive_iterator;
      if ((_Base_ptr)local_220._0_8_ == (_Base_ptr)(local_220 + 0x10)) {
        local_2c8[0]._M_dataplus._M_p = (pointer)local_220._24_8_;
      }
      else {
        attr.m_it.object_iterator._M_node = (_Base_ptr)local_220._0_8_;
      }
      attr.m_it.array_iterator._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            *)local_220._8_8_;
      local_220._8_8_ = (_Base_ptr)0x0;
      local_220._16_8_ = local_220._16_8_ & 0xffffffffffffff00;
      local_220._0_8_ = (_Base_ptr)(local_220 + 0x10);
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&(prVar12->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count,(type)&attr);
      std::__cxx11::string::~string((string *)&attr.m_it);
      std::__cxx11::string::~string((string *)local_220);
      attr.m_object = attr_2.m_object;
      attr.m_it.object_iterator = attr_2.m_it.object_iterator;
      attr.m_it.array_iterator = attr_2.m_it.array_iterator;
      attr.m_it.primitive_iterator = attr_2.m_it.primitive_iterator;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_220,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attr);
    }
    this_02 = &local_1b0;
    local_150.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::string,_std::allocator<(anonymous_namespace)::string>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::string,_std::allocator<(anonymous_namespace)::string>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&local_150);
    (local_270->super_schema)._vptr_schema = (_func_int **)pp_Var29;
    local_1b0.object_iterator._M_node = (_Base_ptr)0x0;
    (local_270->super_schema).root_ = prVar12;
    goto LAB_0011a45f;
  case 4:
    prVar12 = (root_schema *)operator_new(0x30);
    attr.m_object = (pointer)&__a2_1;
    *(undefined8 *)((long)&(prVar12->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar12->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_001553f8;
    pp_Var29 = &(prVar12->loader_).super__Function_base._M_manager;
    anon_unknown.dwarf_4926e::schema::schema((schema *)pp_Var29,root);
    (prVar12->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__00155448;
    attr.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::boolean_type,_std::allocator<(anonymous_namespace)::boolean_type>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::boolean_type,_std::allocator<(anonymous_namespace)::boolean_type>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&attr);
    break;
  case 5:
  case 6:
    local_98.object = (object_t *)0x0;
    jVar13.object = (object_t *)operator_new(0x68);
    ___a2_1 = (pointer)&__a2;
    *(undefined8 *)
     ((long)&(((schema_loader *)
              &(jVar13.array)->
               super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              )->super__Function_base)._M_functor + 8) = 0x100000001;
    *(undefined ***)
     &(((schema_loader *)
       &(jVar13.array)->
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       )->super__Function_base)._M_functor = &PTR___Sp_counted_ptr_inplace_00155218;
    this_01 = &((jVar13.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    jStack_118.object = jVar13.object;
    anon_unknown.dwarf_4926e::schema::schema((schema *)this_01,root);
    (((schema_loader *)
     &(jVar13.array)->
      super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
     )->super__Function_base)._M_manager = (_Manager_type)&PTR_make_for_default__00155268;
    *(undefined1 *)(jVar13.number_integer + 0x30) = 0;
    *(_Invoker_type *)(jVar13.number_integer + 0x38) = (_Invoker_type)0x0;
    (((content_checker *)(jVar13.number_integer + 0x40))->super__Function_base)._M_functor.
    _M_pod_data[0] = '\0';
    *(undefined8 *)(jVar13.number_integer + 0x48) = 0;
    *(undefined2 *)(jVar13.number_integer + 0x50) = 0;
    *(undefined1 *)(jVar13.number_integer + 0x58) = 0;
    (((shared_ptr<(anonymous_namespace)::schema> *)(jVar13.number_integer + 0x60))->
    super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[8],_0>(&attr,schema,(char (*) [8])"maximum");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)&attr_2,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr,(const_iterator *)&attr_2);
    if (bVar9) {
      pbVar14 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr);
      p_Var10 = (_Invoker_type)
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<long,_0>(pbVar14);
      *(undefined1 *)(jVar13.number_integer + 0x30) = 1;
      *(_Invoker_type *)(jVar13.number_integer + 0x38) = p_Var10;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&attr_2,"maximum",(allocator<char> *)&local_198);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr_2)
      ;
      std::__cxx11::string::~string((string *)&attr_2);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[8],_0>((const_iterator *)&attr_2,schema,(char (*) [8])"minimum");
    attr.m_it.array_iterator = attr_2.m_it.array_iterator;
    attr.m_it.primitive_iterator = attr_2.m_it.primitive_iterator;
    attr.m_object = attr_2.m_object;
    attr.m_it.object_iterator = attr_2.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)&attr_2,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr,(const_iterator *)&attr_2);
    if (bVar9) {
      pbVar14 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr);
      lVar11 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::get_impl<long,_0>(pbVar14);
      (((content_checker *)(jVar13.number_integer + 0x40))->super__Function_base)._M_functor.
      _M_pod_data[0] = '\x01';
      *(long *)(jVar13.number_integer + 0x48) = lVar11;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&attr_2,"minimum",(allocator<char> *)&local_198);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr_2)
      ;
      std::__cxx11::string::~string((string *)&attr_2);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[17],_0>
              ((const_iterator *)&attr_2,schema,(char (*) [17])"exclusiveMaximum");
    attr.m_it.array_iterator = attr_2.m_it.array_iterator;
    attr.m_it.primitive_iterator = attr_2.m_it.primitive_iterator;
    attr.m_object = attr_2.m_object;
    attr.m_it.object_iterator = attr_2.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)&attr_2,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr,(const_iterator *)&attr_2);
    if (bVar9) {
      *(undefined1 *)(jVar13.number_integer + 0x50) = 1;
      pbVar14 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr);
      p_Var10 = (_Invoker_type)
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<long,_0>(pbVar14);
      *(undefined1 *)(jVar13.number_integer + 0x30) = 1;
      *(_Invoker_type *)(jVar13.number_integer + 0x38) = p_Var10;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&attr_2,"exclusiveMaximum",(allocator<char> *)&local_198);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr_2)
      ;
      std::__cxx11::string::~string((string *)&attr_2);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[17],_0>
              ((const_iterator *)&attr_2,schema,(char (*) [17])"exclusiveMinimum");
    attr.m_it.array_iterator = attr_2.m_it.array_iterator;
    attr.m_it.primitive_iterator = attr_2.m_it.primitive_iterator;
    attr.m_object = attr_2.m_object;
    attr.m_it.object_iterator = attr_2.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)&attr_2,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr,(const_iterator *)&attr_2);
    if (bVar9) {
      *(undefined1 *)(jVar13.number_integer + 0x51) = 1;
      pbVar14 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr);
      lVar11 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::get_impl<long,_0>(pbVar14);
      (((content_checker *)(jVar13.number_integer + 0x40))->super__Function_base)._M_functor.
      _M_pod_data[0] = '\x01';
      *(long *)(jVar13.number_integer + 0x48) = lVar11;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&attr_2,"exclusiveMinimum",(allocator<char> *)&local_198);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr_2)
      ;
      std::__cxx11::string::~string((string *)&attr_2);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[11],_0>((const_iterator *)&attr_2,schema,(char (*) [11])"multipleOf");
    attr.m_it.array_iterator = attr_2.m_it.array_iterator;
    attr.m_it.primitive_iterator = attr_2.m_it.primitive_iterator;
    attr.m_object = attr_2.m_object;
    attr.m_it.object_iterator = attr_2.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)&attr_2,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr,(const_iterator *)&attr_2);
    if (bVar9) {
      pbVar14 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr);
      peVar3 = (element_type *)
               nlohmann::json_abi_v3_11_2::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::get_impl<double,_0>(pbVar14);
      *(undefined1 *)(jVar13.number_integer + 0x58) = 1;
      (((shared_ptr<(anonymous_namespace)::schema> *)(jVar13.number_integer + 0x60))->
      super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar3
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&attr_2,"multipleOf",(allocator<char> *)&local_198);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr_2)
      ;
      std::__cxx11::string::~string((string *)&attr_2);
    }
    jStack_118.object = (object_t *)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::numeric<long>,_std::allocator<(anonymous_namespace)::numeric<long>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::numeric<long>,_std::allocator<(anonymous_namespace)::numeric<long>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&__a2_1);
    goto LAB_00118503;
  case 7:
    local_98.object = (object_t *)0x0;
    jVar13.object = (object_t *)operator_new(0x68);
    ___a2_1 = (pointer)&__a2;
    *(undefined8 *)
     ((long)&(((schema_loader *)
              &(jVar13.array)->
               super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              )->super__Function_base)._M_functor + 8) = 0x100000001;
    *(undefined ***)
     &(((schema_loader *)
       &(jVar13.array)->
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       )->super__Function_base)._M_functor = &PTR___Sp_counted_ptr_inplace_001552b8;
    this_01 = &((jVar13.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    jStack_118.object = jVar13.object;
    anon_unknown.dwarf_4926e::schema::schema((schema *)this_01,root);
    (((schema_loader *)
     &(jVar13.array)->
      super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
     )->super__Function_base)._M_manager = (_Manager_type)&PTR_make_for_default__00155308;
    *(undefined1 *)(jVar13.number_integer + 0x30) = 0;
    *(_Invoker_type *)(jVar13.number_integer + 0x38) = (_Invoker_type)0x0;
    (((content_checker *)(jVar13.number_integer + 0x40))->super__Function_base)._M_functor.
    _M_pod_data[0] = '\0';
    *(undefined8 *)(jVar13.number_integer + 0x48) = 0;
    *(undefined2 *)(jVar13.number_integer + 0x50) = 0;
    *(undefined1 *)(jVar13.number_integer + 0x58) = 0;
    (((shared_ptr<(anonymous_namespace)::schema> *)(jVar13.number_integer + 0x60))->
    super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[8],_0>(&attr,schema,(char (*) [8])"maximum");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)&attr_2,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr,(const_iterator *)&attr_2);
    if (bVar9) {
      pbVar14 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr);
      p_Var10 = (_Invoker_type)
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<double,_0>(pbVar14);
      *(undefined1 *)(jVar13.number_integer + 0x30) = 1;
      *(_Invoker_type *)(jVar13.number_integer + 0x38) = p_Var10;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&attr_2,"maximum",(allocator<char> *)&local_198);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr_2)
      ;
      std::__cxx11::string::~string((string *)&attr_2);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[8],_0>((const_iterator *)&attr_2,schema,(char (*) [8])"minimum");
    attr.m_it.array_iterator = attr_2.m_it.array_iterator;
    attr.m_it.primitive_iterator = attr_2.m_it.primitive_iterator;
    attr.m_object = attr_2.m_object;
    attr.m_it.object_iterator = attr_2.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)&attr_2,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr,(const_iterator *)&attr_2);
    if (bVar9) {
      pbVar14 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr);
      dVar2 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<double,_0>(pbVar14);
      (((content_checker *)(jVar13.number_integer + 0x40))->super__Function_base)._M_functor.
      _M_pod_data[0] = '\x01';
      *(double *)(jVar13.number_integer + 0x48) = dVar2;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&attr_2,"minimum",(allocator<char> *)&local_198);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr_2)
      ;
      std::__cxx11::string::~string((string *)&attr_2);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[17],_0>
              ((const_iterator *)&attr_2,schema,(char (*) [17])"exclusiveMaximum");
    attr.m_it.array_iterator = attr_2.m_it.array_iterator;
    attr.m_it.primitive_iterator = attr_2.m_it.primitive_iterator;
    attr.m_object = attr_2.m_object;
    attr.m_it.object_iterator = attr_2.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)&attr_2,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr,(const_iterator *)&attr_2);
    if (bVar9) {
      *(undefined1 *)(jVar13.number_integer + 0x50) = 1;
      pbVar14 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr);
      p_Var10 = (_Invoker_type)
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<double,_0>(pbVar14);
      *(undefined1 *)(jVar13.number_integer + 0x30) = 1;
      *(_Invoker_type *)(jVar13.number_integer + 0x38) = p_Var10;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&attr_2,"exclusiveMaximum",(allocator<char> *)&local_198);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr_2)
      ;
      std::__cxx11::string::~string((string *)&attr_2);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[17],_0>
              ((const_iterator *)&attr_2,schema,(char (*) [17])"exclusiveMinimum");
    attr.m_it.array_iterator = attr_2.m_it.array_iterator;
    attr.m_it.primitive_iterator = attr_2.m_it.primitive_iterator;
    attr.m_object = attr_2.m_object;
    attr.m_it.object_iterator = attr_2.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)&attr_2,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr,(const_iterator *)&attr_2);
    if (bVar9) {
      *(undefined1 *)(jVar13.number_integer + 0x51) = 1;
      pbVar14 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr);
      dVar2 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<double,_0>(pbVar14);
      (((content_checker *)(jVar13.number_integer + 0x40))->super__Function_base)._M_functor.
      _M_pod_data[0] = '\x01';
      *(double *)(jVar13.number_integer + 0x48) = dVar2;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&attr_2,"exclusiveMinimum",(allocator<char> *)&local_198);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr_2)
      ;
      std::__cxx11::string::~string((string *)&attr_2);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[11],_0>((const_iterator *)&attr_2,schema,(char (*) [11])"multipleOf");
    attr.m_it.array_iterator = attr_2.m_it.array_iterator;
    attr.m_it.primitive_iterator = attr_2.m_it.primitive_iterator;
    attr.m_object = attr_2.m_object;
    attr.m_it.object_iterator = attr_2.m_it.object_iterator;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)&attr_2,schema);
    bVar9 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&attr,(const_iterator *)&attr_2);
    if (bVar9) {
      pbVar14 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr);
      peVar3 = (element_type *)
               nlohmann::json_abi_v3_11_2::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::get_impl<double,_0>(pbVar14);
      *(undefined1 *)(jVar13.number_integer + 0x58) = 1;
      (((shared_ptr<(anonymous_namespace)::schema> *)(jVar13.number_integer + 0x60))->
      super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar3
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&attr_2,"multipleOf",(allocator<char> *)&local_198);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr_2)
      ;
      std::__cxx11::string::~string((string *)&attr_2);
    }
    jStack_118.object = (object_t *)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::numeric<double>,_std::allocator<(anonymous_namespace)::numeric<double>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::numeric<double>,_std::allocator<(anonymous_namespace)::numeric<double>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&__a2_1);
LAB_00118503:
    this_02 = &local_90;
    (local_270->super_schema)._vptr_schema = (_func_int **)this_01;
    local_90.object_iterator._M_node = (_Base_ptr)0x0;
    (local_270->super_schema).root_ = (root_schema *)jVar13;
    local_98.object = (object_t *)0x0;
    this = local_270;
    goto LAB_0011a467;
  default:
    (this->super_schema)._vptr_schema = (_func_int **)0x0;
    (this->super_schema).root_ = (root_schema *)0x0;
    goto LAB_0011a46f;
  }
  this_02 = &attr_2.m_it;
  (local_270->super_schema)._vptr_schema = (_func_int **)pp_Var29;
  attr_2.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  (local_270->super_schema).root_ = prVar12;
LAB_0011a45f:
  this = local_270;
  this_02[-1].primitive_iterator.m_it = 0;
LAB_0011a467:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_02);
  _Var28._M_pi = extraout_RDX_00;
LAB_0011a46f:
  sVar32.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var28._M_pi;
  sVar32.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_schema;
  return (shared_ptr<(anonymous_namespace)::schema>)
         sVar32.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<schema> type_schema::make(json &schema,
                                          json::value_t type,
                                          root_schema *root,
                                          const std::vector<nlohmann::json_uri> &uris,
                                          std::set<std::string> &kw)
{
	switch (type) {
	case json::value_t::null:
		return std::make_shared<null>(schema, root);

	case json::value_t::number_unsigned:
	case json::value_t::number_integer:
		return std::make_shared<numeric<json::number_integer_t>>(schema, root, kw);
	case json::value_t::number_float:
		return std::make_shared<numeric<json::number_float_t>>(schema, root, kw);
	case json::value_t::string:
		return std::make_shared<string>(schema, root);
	case json::value_t::boolean:
		return std::make_shared<boolean_type>(schema, root);
	case json::value_t::object:
		return std::make_shared<object>(schema, root, uris);
	case json::value_t::array:
		return std::make_shared<array>(schema, root, uris);

	case json::value_t::discarded: // not a real type - silence please
		break;

	case json::value_t::binary:
		break;
	}
	return nullptr;
}